

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
join_function::evaluate
          (join_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  bool bVar2;
  bool bVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar4;
  iterator this_01;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  reference pbVar6;
  assertion_error *this_02;
  uint uVar7;
  const_array_range_type cVar8;
  string_view_type sVar9;
  string_type sep;
  string_type buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_02 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"assertion \'args.size() == *this->arity()\' failed at  <> :0",""
              );
    assertion_error::assertion_error(this_02,&local_70);
    __cxa_throw(this_02,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ppVar1->type_ == value) && (ppVar1[1].type_ == value)) {
    this_00 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
              (ppVar1->field_1).value_;
    pbVar5 = ppVar1[1].field_1.value_;
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00);
    pbVar4 = pbVar5;
    if (bVar2) {
      while (uVar7 = *(byte *)&pbVar4->field_0 & 0xf, uVar7 - 8 < 2) {
        pbVar4 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                  ((long)&pbVar4->field_0 + 8);
      }
      if (uVar7 == 0xe) {
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        as_string<std::allocator<char>>(&local_70,this_00,(allocator<char> *)&local_50);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        cVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                          (pbVar5);
        this_01 = cVar8.first_._M_current;
        if (this_01._M_current != cVar8.last_._M_current._M_current) {
          bVar2 = true;
          do {
            bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                              (this_01._M_current);
            if (!bVar3) {
              std::error_code::operator=(ec,invalid_type);
              pbVar5 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       ::null_value(context);
              goto LAB_00367544;
            }
            if (!bVar2) {
              std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
            }
            sVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                              (this_01._M_current);
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                      (this_01._M_current);
            std::__cxx11::string::replace
                      ((ulong)&local_50,local_50._M_string_length,(char *)0x0,(ulong)sVar9._M_str);
            this_01._M_current = this_01._M_current + 1;
            bVar2 = false;
          } while (this_01._M_current != cVar8.last_._M_current._M_current);
        }
        pbVar5 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                 ::create_json<std::__cxx11::string&>
                           ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                             *)context,&local_50);
LAB_00367544:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                   local_50.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        return pbVar5;
      }
    }
  }
  std::error_code::operator=(ec,invalid_type);
  pbVar6 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar6;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                reference arg0 = args[0].value();
                reference arg1 = args[1].value();

                if (!(args[0].is_value() && args[1].is_value()))
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                if (!arg0.is_string())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                if (!arg1.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                string_type sep = arg0.template as<string_type>();
                string_type buf;
                bool is_first = true;
                for (auto &j : arg1.array_range())
                {
                    if (!j.is_string())
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }

                    if (is_first)
                    {
                        is_first = false;
                    }
                    else
                    {
                        buf.append(sep);
                    }
                    
                    auto sv = j.template as<string_view_type>();
                    buf.append(sv.begin(), sv.end());
                }
                return *context.create_json(buf);
            }